

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::draw_line(OSDText *this,OSDLine *line)

{
  int iVar1;
  float fVar2;
  float local_88;
  float local_84;
  point box [4];
  float h;
  float w;
  float y2;
  float x2;
  char *text;
  FT_GlyphSlot_conflict pFStack_28;
  GLuint tex;
  FT_GlyphSlot_conflict g;
  char *p;
  OSDLine *line_local;
  OSDText *this_local;
  
  p = (char *)line;
  line_local = (OSDLine *)this;
  FT_Set_Pixel_Sizes(*this->face,0,line->size & 0xffffffff);
  (*__glewUniform4fv)(this->uniform_color,1,&(line->color).r);
  pFStack_28 = (*this->face)->glyph;
  (*__glewActiveTexture)(0x84c0);
  glGenTextures(1,(long)&text + 4);
  glBindTexture(0xde1,text._4_4_);
  (*__glewUniform1i)(this->uniform_tex,0);
  glPixelStorei(0xcf5,1);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  (*__glewEnableVertexAttribArray)(this->attribute_coord);
  (*__glewBindBuffer)(0x8892,this->vbo);
  (*__glewVertexAttribPointer)(this->attribute_coord,4,0x1406,'\0',0,(void *)0x0);
  for (g = (FT_GlyphSlot_conflict)std::__cxx11::string::c_str(); *(char *)&g->library != '\0';
      g = (FT_GlyphSlot_conflict)((long)&g->library + 1)) {
    iVar1 = FT_Load_Char(*this->face,(long)*(char *)&g->library,4);
    if (iVar1 == 0) {
      glTexImage2D(0xde1,0,0x1906,(pFStack_28->bitmap).width,(pFStack_28->bitmap).rows,0,0x1906,
                   0x1401,(pFStack_28->bitmap).buffer);
      local_88 = (float)pFStack_28->bitmap_left * this->sx + line->x;
      fVar2 = -(float)pFStack_28->bitmap_top * this->sy - line->y;
      box[3].t = (float)(pFStack_28->bitmap).width * this->sx;
      box[3].s = (float)(pFStack_28->bitmap).rows * this->sy;
      local_84 = -fVar2;
      box[0].x = 0.0;
      box[0].y = 0.0;
      box[0].s = local_88 + box[3].t;
      box[0].t = -fVar2;
      box[1].x = 1.0;
      box[1].y = 0.0;
      box[1].t = -fVar2 - box[3].s;
      box[2].x = 0.0;
      box[2].y = 1.0;
      box[2].s = local_88 + box[3].t;
      box[2].t = -fVar2 - box[3].s;
      box[3].x = 1.0;
      box[3].y = 1.0;
      box[1].s = local_88;
      (*__glewBufferData)(0x8892,0x40,&local_88,0x88e8);
      glDrawArrays(5,0,4);
      line->x = (float)((pFStack_28->advance).x >> 6) * this->sx + line->x;
      line->y = (float)((pFStack_28->advance).y >> 6) * this->sy + line->y;
    }
  }
  (*__glewDisableVertexAttribArray)(this->attribute_coord);
  glDeleteTextures(1,(long)&text + 4);
  return;
}

Assistant:

void OSDText::draw_line(OSDLine line) {

  // set font size
  FT_Set_Pixel_Sizes(*face, 0, line.size);

  // set font color
  glUniform4fv(uniform_color, 1, (GLfloat*) &line.color);

  // get glyph
  const char *p;
  FT_GlyphSlot g = (*face)->glyph;

  // gen texture
  GLuint tex;
  glActiveTexture(GL_TEXTURE0);
  glGenTextures(1, &tex);
  glBindTexture(GL_TEXTURE_2D, tex);
  glUniform1i(uniform_tex, 0);

  // require 1 byte alignment when uploading texture data
  glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

  // clamping to edges is important to prevent artifacts when scaling
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

  // linear filtering usually looks best for text
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

  // set up the VBO for our vertex data
  glEnableVertexAttribArray(attribute_coord);
  glBindBuffer(GL_ARRAY_BUFFER, vbo);
  glVertexAttribPointer(attribute_coord, 4, GL_FLOAT, GL_FALSE, 0, 0);

  // loop through all characters
  const char* text = line.text.c_str();
  for (p = text; *p; p++) {

    // Try to load and render the character
    if (FT_Load_Char(*face, *p, FT_LOAD_RENDER)) continue;

    // Upload the glyph bitmap as an alpha texture
    glTexImage2D(GL_TEXTURE_2D,
                 0, GL_ALPHA, g->bitmap.width, g->bitmap.rows,
                 0, GL_ALPHA, GL_UNSIGNED_BYTE, g->bitmap.buffer);

    // calculate the vertex and texture coordinates
    float x2 =  line.x + g->bitmap_left * sx;
    float y2 = -line.y - g->bitmap_top  * sy;
    float w = g->bitmap.width * sx;
    float h = g->bitmap.rows  * sy;

    point box[4] = {
      {x2, -y2, 0, 0},
      {x2 + w, -y2, 1, 0},
      {x2, -y2 - h, 0, 1},
      {x2 + w, -y2 - h, 1, 1},
    };

    // draw the character to screen
    glBufferData(GL_ARRAY_BUFFER, sizeof box, box, GL_DYNAMIC_DRAW);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    // Advance the cursor to the start of the next character
    line.x += (g->advance.x >> 6) * sx;
    line.y += (g->advance.y >> 6) * sy;
  }

  glDisableVertexAttribArray(attribute_coord);
  glDeleteTextures(1, &tex);

}